

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1553.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  timeval tVar9;
  int still_running;
  int num;
  int local_44;
  undefined8 local_40;
  undefined1 local_34 [4];
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar6 = _stderr;
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                  ,0x38,iVar1,uVar3);
  }
  if (iVar1 != 0) goto LAB_001016d1;
  lVar4 = curl_multi_init();
  iVar1 = 0;
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                  ,0x3a);
    iVar1 = 0x7b;
  }
  iVar2 = 0;
  if (lVar4 == 0) {
    lVar5 = 0;
    uVar6 = 0;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                    ,0x3c);
      iVar2 = 0x7c;
    }
    if (lVar5 == 0) {
      uVar6 = 0;
      iVar1 = iVar2;
    }
    else {
      local_40 = curl_mime_init(lVar5);
      uVar6 = curl_mime_addpart(local_40);
      curl_mime_name(uVar6,"name");
      curl_mime_data(uVar6,"value",0xffffffffffffffff);
      iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
      uVar6 = _stderr;
      iVar1 = 0;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar6,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                      ,0x43,iVar2,uVar3);
        iVar1 = iVar2;
      }
      uVar6 = local_40;
      if (iVar1 == 0) {
        iVar2 = curl_easy_setopt(lVar5,0x2a,1);
        uVar6 = _stderr;
        iVar1 = 0;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar6,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                        ,0x44,iVar2,uVar3);
          iVar1 = iVar2;
        }
        uVar6 = local_40;
        if (iVar1 == 0) {
          iVar2 = curl_easy_setopt(lVar5,0x29,1);
          uVar3 = _stderr;
          iVar1 = 0;
          if (iVar2 != 0) {
            uVar7 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                          ,0x45,iVar2,uVar7);
            iVar1 = iVar2;
          }
          if (iVar1 == 0) {
            iVar2 = curl_easy_setopt(lVar5,0x281d,uVar6);
            uVar3 = _stderr;
            iVar1 = 0;
            if (iVar2 != 0) {
              uVar7 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                            ,0x46,iVar2,uVar7);
              iVar1 = iVar2;
            }
            if (iVar1 == 0) {
              iVar2 = curl_easy_setopt(lVar5,0x2715,"u:s");
              uVar3 = _stderr;
              iVar1 = 0;
              if (iVar2 != 0) {
                uVar7 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                              ,0x47,iVar2,uVar7);
                iVar1 = iVar2;
              }
              if (iVar1 == 0) {
                iVar2 = curl_easy_setopt(lVar5,0x4efb,xferinfo);
                uVar3 = _stderr;
                iVar1 = 0;
                if (iVar2 != 0) {
                  uVar7 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                ,0x48,iVar2,uVar7);
                  iVar1 = iVar2;
                }
                if (iVar1 == 0) {
                  iVar2 = curl_easy_setopt(lVar5,0x2b,1);
                  uVar3 = _stderr;
                  iVar1 = 0;
                  if (iVar2 != 0) {
                    uVar7 = curl_easy_strerror(iVar2);
                    curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                  ,0x49,iVar2,uVar7);
                    iVar1 = iVar2;
                  }
                  if (iVar1 == 0) {
                    iVar1 = curl_multi_add_handle(lVar4,lVar5);
                    uVar6 = _stderr;
                    if (iVar1 == 0) {
                      iVar1 = 0;
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar1);
                      curl_mfprintf(uVar6,
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                    ,0x4b,iVar1,uVar3);
                    }
                    uVar6 = local_40;
                    if (iVar1 == 0) {
                      iVar1 = curl_multi_perform(lVar4,&local_44);
                      uVar6 = _stderr;
                      if (iVar1 == 0) {
                        iVar1 = 0;
                        if (local_44 < 0) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                        ,0x4d);
                          iVar1 = 0x7a;
                        }
                      }
                      else {
                        uVar3 = curl_multi_strerror(iVar1);
                        curl_mfprintf(uVar6,"%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                      ,0x4d,iVar1,uVar3);
                      }
                      uVar6 = local_40;
                      if (iVar1 == 0) {
                        tVar9 = tutil_tvnow();
                        lVar8 = tutil_tvdiff(tVar9,tv_test_start);
                        iVar1 = 0;
                        if (lVar8 < 0xea61) {
                          uVar6 = local_40;
                          if (local_44 != 0) {
                            iVar1 = 0;
                            iVar2 = curl_multi_wait(lVar4,0,0,60000,local_34);
                            if (iVar2 == 0) {
                              tVar9 = tutil_tvnow();
                              lVar8 = tutil_tvdiff(tVar9,tv_test_start);
                              if (60000 < lVar8) {
                                curl_mfprintf(_stderr,
                                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                              ,0x5a);
                                iVar1 = 0x7d;
                              }
                              iVar2 = 0xc;
                              if (lVar8 < 0xea61) {
                                iVar1 = curl_multi_perform(lVar4,&local_44);
                                uVar6 = _stderr;
                                if (iVar1 == 0) {
                                  iVar1 = 0;
                                  if (local_44 < 0) {
                                    curl_mfprintf(_stderr,
                                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                                  ,0x5c);
                                    iVar1 = 0x7a;
                                  }
                                }
                                else {
                                  uVar3 = curl_multi_strerror(iVar1);
                                  curl_mfprintf(uVar6,
                                                "%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                                ,0x5c,iVar1,uVar3);
                                }
                                if (iVar1 == 0) {
                                  tVar9 = tutil_tvnow();
                                  lVar8 = tutil_tvdiff(tVar9,tv_test_start);
                                  iVar2 = 0;
                                  iVar1 = 0;
                                  if (60000 < lVar8) {
                                    curl_mfprintf(_stderr,
                                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                                  ,0x5e);
                                    iVar1 = 0x7d;
                                    goto LAB_00101860;
                                  }
                                }
                              }
                            }
                            else {
                              curl_mprintf("curl_multi_wait() returned %d\n",iVar2);
                              iVar1 = 0x7e;
LAB_00101860:
                              iVar2 = 0xc;
                            }
                            uVar6 = local_40;
                            if ((iVar2 != 0xc) && (iVar2 != 0)) goto LAB_001016d1;
                          }
                        }
                        else {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1553.c"
                                        ,0x4f);
                          iVar1 = 0x7d;
                          uVar6 = local_40;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  curl_mime_free(uVar6);
  curl_multi_remove_handle(lVar4,lVar5);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
LAB_001016d1:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = 0;
  int res = 0;
  curl_mimepart *field = NULL;
  curl_mime *mime = NULL;
  int counter = 1;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  mime = curl_mime_init(curls);
  field = curl_mime_addpart(mime);
  curl_mime_name(field, "name");
  curl_mime_data(field, "value", CURL_ZERO_TERMINATED);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_MIMEPOST, mime);
  easy_setopt(curls, CURLOPT_USERPWD, "u:s");
  easy_setopt(curls, CURLOPT_XFERINFOFUNCTION, xferinfo);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running && counter--) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  curl_mime_free(mime);
  curl_multi_remove_handle(multi, curls);
  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}